

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void gen_h4grams(uint8_t *mem,uint64_t size,TrigramCallback *cb)

{
  uint uVar1;
  uint uVar2;
  uint64_t offset;
  ulong uVar3;
  
  if (3 < size) {
    uVar2 = 0;
    for (uVar3 = 0; size != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = (uint)mem[uVar3] | uVar2 << 8;
      if (2 < uVar3) {
        std::function<void_(unsigned_int)>::operator()(cb,(uVar2 ^ uVar1) & 0xffffff);
      }
      uVar2 = uVar1;
    }
  }
  return;
}

Assistant:

void gen_h4grams(const uint8_t *mem, uint64_t size, const TrigramCallback &cb) {
    if (size < 4) {
        return;
    }

    uint32_t gram4 = 0;

    for (uint64_t offset = 0; offset < size; offset++) {
        gram4 = ((gram4 & 0xFFFFFFU) << 8U) | mem[offset];

        if (offset >= 3) {
            cb(((gram4 >> 8U) & 0xFFFFFFU) ^ (gram4 & 0xFFFFFFU));
        }
    }
}